

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

int icu_63::number::impl::PatternStringUtils::escapePaddingString
              (UnicodeString *input,UnicodeString *output,int startIndex,UErrorCode *status)

{
  int8_t iVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char16_t *pcVar6;
  undefined4 in_register_00000014;
  int32_t iVar7;
  int iVar8;
  long lVar9;
  UChar local_74;
  int16_t local_72;
  undefined8 local_70;
  int local_64;
  char16_t *local_50;
  char16_t *local_40;
  
  local_70 = CONCAT44(in_register_00000014,startIndex);
  sVar2 = (input->fUnion).fStackFields.fLengthAndFlags;
  iVar5 = (int)sVar2 >> 5;
  iVar8 = (input->fUnion).fFields.fLength;
  iVar4 = iVar5;
  if (sVar2 < 0) {
    iVar4 = iVar8;
  }
  if (iVar4 == 0) {
    UnicodeString::unBogus(input);
    sVar2 = (input->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar7 = (input->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar2 >> 5;
    }
    UnicodeString::doReplace(input,0,iVar7,L" ",0,-1);
    sVar2 = (input->fUnion).fStackFields.fLengthAndFlags;
    iVar8 = (input->fUnion).fFields.fLength;
    iVar5 = (int)sVar2 >> 5;
  }
  local_72 = (output->fUnion).fStackFields.fLengthAndFlags;
  local_64 = (output->fUnion).fFields.fLength;
  if (sVar2 < 0) {
    iVar5 = iVar8;
  }
  if (iVar5 == 1) {
    iVar1 = UnicodeString::doCompare(input,0,1,L"\'",0,-1);
    local_50 = L"\'";
    if (iVar1 == '\0') {
      UnicodeString::doReplace(output,(int32_t)local_70,0,L"\'\'",0,-1);
    }
    else {
      sVar2 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar7 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar7 = (int)sVar2 >> 5;
      }
      UnicodeString::doReplace(output,(int32_t)local_70,0,input,0,iVar7);
    }
  }
  else {
    local_74 = L'\'';
    iVar8 = 1;
    UnicodeString::doReplace(output,(int32_t)local_70,0,&local_74,0,1);
    sVar2 = (input->fUnion).fStackFields.fLengthAndFlags;
    uVar3 = (uint)sVar2;
    if (sVar2 < 0) {
      iVar4 = (input->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)uVar3 >> 5;
    }
    if (0 < iVar4) {
      iVar8 = 1;
      lVar9 = 0;
      do {
        pcVar6 = (char16_t *)((long)&input->fUnion + 2);
        if ((uVar3 & 2) == 0) {
          pcVar6 = (input->fUnion).fFields.fArray;
        }
        iVar4 = iVar8 + (int)local_70;
        if (pcVar6[lVar9] == L'\'') {
          UnicodeString::doReplace(output,iVar4,0,L"\'\'",0,-1);
          local_40 = L"\'\'";
          iVar5 = 2;
        }
        else {
          iVar5 = 1;
          local_74 = pcVar6[lVar9];
          UnicodeString::doReplace(output,iVar4,0,&local_74,0,1);
        }
        sVar2 = (input->fUnion).fStackFields.fLengthAndFlags;
        uVar3 = (uint)sVar2;
        if (sVar2 < 0) {
          iVar4 = (input->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)uVar3 >> 5;
        }
        iVar8 = iVar8 + iVar5;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    local_74 = L'\'';
    UnicodeString::doReplace(output,iVar8 + (int)local_70,0,&local_74,0,1);
  }
  iVar8 = (int)local_72 >> 5;
  if (local_72 < 0) {
    iVar8 = local_64;
  }
  sVar2 = (output->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar4 = (output->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar2 >> 5;
  }
  return iVar4 - iVar8;
}

Assistant:

int PatternStringUtils::escapePaddingString(UnicodeString input, UnicodeString& output, int startIndex,
                                            UErrorCode& status) {
    (void) status;
    if (input.length() == 0) {
        input.setTo(kFallbackPaddingString, -1);
    }
    int startLength = output.length();
    if (input.length() == 1) {
        if (input.compare(u"'", -1) == 0) {
            output.insert(startIndex, u"''", -1);
        } else {
            output.insert(startIndex, input);
        }
    } else {
        output.insert(startIndex, u'\'');
        int offset = 1;
        for (int i = 0; i < input.length(); i++) {
            // it's okay to deal in chars here because the quote mark is the only interesting thing.
            char16_t ch = input.charAt(i);
            if (ch == u'\'') {
                output.insert(startIndex + offset, u"''", -1);
                offset += 2;
            } else {
                output.insert(startIndex + offset, ch);
                offset += 1;
            }
        }
        output.insert(startIndex + offset, u'\'');
    }
    return output.length() - startLength;
}